

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcUniformBlockCase.cpp
# Opt level: O0

bool __thiscall
deqp::UniformBlockCase::checkLayoutBounds(UniformBlockCase *this,UniformLayout *layout)

{
  size_type sVar1;
  MessageBuilder *pMVar2;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  MessageBuilder local_1e0;
  int local_60;
  int local_5c;
  int maxOffset;
  int minOffset;
  int vecSize;
  int compSize;
  int numElements;
  int numComps;
  int numVecs;
  bool isMatrix;
  BlockLayoutEntry *block;
  UniformLayoutEntry *uniform;
  byte local_25;
  int uniformNdx;
  bool isOk;
  TestLog *pTStack_20;
  int numUniforms;
  TestLog *log;
  UniformLayout *layout_local;
  UniformBlockCase *this_local;
  
  log = (TestLog *)layout;
  layout_local = (UniformLayout *)this;
  pTStack_20 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  sVar1 = std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>::
          size((vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                *)(log + 3));
  uniformNdx = (int)sVar1;
  local_25 = 1;
  for (uniform._4_4_ = 0; uniform._4_4_ < uniformNdx; uniform._4_4_ = uniform._4_4_ + 1) {
    block = (BlockLayoutEntry *)
            std::vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
            ::operator[]((vector<deqp::ub::UniformLayoutEntry,_std::allocator<deqp::ub::UniformLayoutEntry>_>
                          *)(log + 3),(long)uniform._4_4_);
    if (-1 < ((const_reference)block)->blockNdx) {
      _numVecs = std::
                 vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>::
                 operator[]((vector<deqp::ub::BlockLayoutEntry,_std::allocator<deqp::ub::BlockLayoutEntry>_>
                             *)log,(long)((const_reference)block)->blockNdx);
      numComps._3_1_ = glu::isDataTypeMatrix(block->size);
      if ((bool)numComps._3_1_) {
        if (((ulong)(block->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
          local_1f0 = glu::getDataTypeMatrixNumColumns(block->size);
        }
        else {
          local_1f0 = glu::getDataTypeMatrixNumRows(block->size);
        }
        local_1f4 = local_1f0;
      }
      else {
        local_1f4 = 1;
      }
      numElements = local_1f4;
      if ((numComps._3_1_ & 1) == 0) {
        local_1fc = glu::getDataTypeScalarSize(block->size);
      }
      else {
        if (((ulong)(block->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
          local_1f8 = glu::getDataTypeMatrixNumRows(block->size);
        }
        else {
          local_1f8 = glu::getDataTypeMatrixNumColumns(block->size);
        }
        local_1fc = local_1f8;
      }
      compSize = local_1fc;
      vecSize = *(int *)&block->field_0x24;
      minOffset = 4;
      maxOffset = local_1fc << 2;
      local_5c = 0;
      local_60 = 0;
      local_5c = de::min<int>(0,(numElements + -1) *
                                *(int *)((long)&(block->activeUniformIndices).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish + 4));
      local_5c = de::min<int>(local_5c,(vecSize + -1) *
                                       *(int *)&(block->activeUniformIndices).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish);
      local_5c = de::min<int>(local_5c,(vecSize + -1) *
                                       *(int *)&(block->activeUniformIndices).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish +
                                       (numElements + -1) *
                                       *(int *)((long)&(block->activeUniformIndices).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish +
                                               4));
      local_60 = de::max<int>(local_60,maxOffset);
      local_60 = de::max<int>(local_60,(numElements + -1) *
                                       *(int *)((long)&(block->activeUniformIndices).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish +
                                               4) + maxOffset);
      local_60 = de::max<int>(local_60,(vecSize + -1) *
                                       *(int *)&(block->activeUniformIndices).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish +
                                       maxOffset);
      local_60 = de::max<int>(local_60,(vecSize + -1) *
                                       *(int *)&(block->activeUniformIndices).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish +
                                       (numElements + -1) *
                                       *(int *)((long)&(block->activeUniformIndices).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish +
                                               4) + maxOffset);
      if ((*(int *)((long)&(block->activeUniformIndices).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + 4) + local_5c < 0) ||
         (_numVecs->size <
          *(int *)((long)&(block->activeUniformIndices).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + 4) + local_60)) {
        tcu::TestLog::operator<<(&local_1e0,pTStack_20,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar2 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [17])"Error: Uniform \'");
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&block->name);
        pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [22])"\' out of block bounds");
        tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1e0);
        local_25 = 0;
      }
    }
  }
  return (bool)(local_25 & 1);
}

Assistant:

bool UniformBlockCase::checkLayoutBounds(const UniformLayout& layout) const
{
	TestLog& log		 = m_testCtx.getLog();
	int		 numUniforms = (int)layout.uniforms.size();
	bool	 isOk		 = true;

	for (int uniformNdx = 0; uniformNdx < numUniforms; uniformNdx++)
	{
		const UniformLayoutEntry& uniform = layout.uniforms[uniformNdx];

		if (uniform.blockNdx < 0)
			continue;

		const BlockLayoutEntry& block	= layout.blocks[uniform.blockNdx];
		bool					isMatrix = glu::isDataTypeMatrix(uniform.type);
		int						numVecs = isMatrix ? (uniform.isRowMajor ? glu::getDataTypeMatrixNumRows(uniform.type) :
													   glu::getDataTypeMatrixNumColumns(uniform.type)) :
								 1;
		int numComps = isMatrix ? (uniform.isRowMajor ? glu::getDataTypeMatrixNumColumns(uniform.type) :
														glu::getDataTypeMatrixNumRows(uniform.type)) :
								  glu::getDataTypeScalarSize(uniform.type);
		int		  numElements = uniform.size;
		const int compSize	= sizeof(deUint32);
		int		  vecSize	 = numComps * compSize;

		int minOffset = 0;
		int maxOffset = 0;

		// For negative strides.
		minOffset = de::min(minOffset, (numVecs - 1) * uniform.matrixStride);
		minOffset = de::min(minOffset, (numElements - 1) * uniform.arrayStride);
		minOffset = de::min(minOffset, (numElements - 1) * uniform.arrayStride + (numVecs - 1) * uniform.matrixStride);

		maxOffset = de::max(maxOffset, vecSize);
		maxOffset = de::max(maxOffset, (numVecs - 1) * uniform.matrixStride + vecSize);
		maxOffset = de::max(maxOffset, (numElements - 1) * uniform.arrayStride + vecSize);
		maxOffset = de::max(maxOffset,
							(numElements - 1) * uniform.arrayStride + (numVecs - 1) * uniform.matrixStride + vecSize);

		if (uniform.offset + minOffset < 0 || uniform.offset + maxOffset > block.size)
		{
			log << TestLog::Message << "Error: Uniform '" << uniform.name << "' out of block bounds"
				<< TestLog::EndMessage;
			isOk = false;
		}
	}

	return isOk;
}